

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::CacheState::perform
          (CacheState *this,VkPipelineStageFlagBits stage,VkAccessFlagBits access)

{
  bool bVar1;
  PipelineStage PVar2;
  PipelineStage PVar3;
  VkPipelineStageFlagBits local_20;
  PipelineStage dstStage;
  VkPipelineStageFlags dstStage_;
  PipelineStage srcStage;
  VkAccessFlagBits access_local;
  VkPipelineStageFlagBits stage_local;
  CacheState *this_local;
  
  PVar2 = pipelineStageFlagToPipelineStage(stage);
  for (local_20 = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT; local_20 <= this->m_allowedStages;
      local_20 = local_20 << 1) {
    PVar3 = pipelineStageFlagToPipelineStage(local_20);
    if ((local_20 & this->m_allowedStages) != 0) {
      this->m_incompleteOperations[PVar3] = stage | this->m_incompleteOperations[PVar3];
      bVar1 = isWriteAccess(access);
      if (bVar1) {
        this->m_invisibleOperations[PVar3] =
             this->m_allowedAccesses | this->m_invisibleOperations[PVar3];
        this->m_unavailableWriteOperations[PVar3][PVar2] =
             access | this->m_unavailableWriteOperations[PVar3][PVar2];
      }
    }
  }
  return;
}

Assistant:

void CacheState::perform (vk::VkPipelineStageFlagBits	stage,
						  vk::VkAccessFlagBits			access)
{
	DE_ASSERT((access & (~m_allowedAccesses)) == 0);
	DE_ASSERT((stage & (~m_allowedStages)) == 0);

	const PipelineStage srcStage = pipelineStageFlagToPipelineStage(stage);

	for (vk::VkPipelineStageFlags dstStage_ = 1; dstStage_ <= m_allowedStages; dstStage_ <<= 1)
	{
		const PipelineStage dstStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)dstStage_);

		if ((dstStage_ & m_allowedStages) == 0)
			continue;

		// Mark stage as incomplete for all stages
		m_incompleteOperations[dstStage] |= stage;

		if (isWriteAccess(access))
		{
			// Mark all accesses from all stages invisible
			m_invisibleOperations[dstStage] |= m_allowedAccesses;

			// Mark write access from srcStage unavailable to all stages
			m_unavailableWriteOperations[dstStage][srcStage] |= access;
		}
	}
}